

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O1

LinTerms * mp::MergeSorted<mp::LinTerms>(LinTerms *__return_storage_ptr__,LinTerms *t1,LinTerms *t2)

{
  SmallVec<int,_6> *this;
  double dVar1;
  int iVar2;
  ulong uVar3;
  size_ty request;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  int local_3c;
  double local_38;
  
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.
             m_data.m_storage;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data
             .m_storage;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  request = (t2->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_size +
            (t1->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  gch::detail::small_vector_base<std::allocator<double>,_6U>::request_capacity
            ((small_vector_base<std::allocator<double>,_6U> *)__return_storage_ptr__,request);
  this = &__return_storage_ptr__->vars_;
  gch::detail::small_vector_base<std::allocator<int>,_6U>::request_capacity
            (&this->super_small_vector_base<std::allocator<int>,_6U>,request);
  uVar3 = 0;
  bVar6 = (t1->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size == 0;
  bVar5 = !bVar6;
  if (bVar6) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    if ((t2->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      uVar4 = 0;
      uVar3 = 0;
      do {
        local_3c = (t1->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
                   super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr[uVar4];
        dVar1 = (t1->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr[uVar4];
        iVar2 = (t2->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr[uVar3];
        if (local_3c < iVar2) {
          local_38 = dVar1;
          gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
                    ((small_vector_base<std::allocator<double>,6u> *)__return_storage_ptr__,
                     &local_38);
          gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
                    ((small_vector_base<std::allocator<int>,6u> *)this,&local_3c);
          uVar4 = uVar4 + 1;
        }
        else {
          local_38 = (t2->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                     super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr[uVar3];
          if (iVar2 < local_3c) {
            local_3c = iVar2;
            gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
                      ((small_vector_base<std::allocator<double>,6u> *)__return_storage_ptr__,
                       &local_38);
            gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
                      ((small_vector_base<std::allocator<int>,6u> *)this,&local_3c);
          }
          else {
            local_38 = dVar1 + local_38;
            if ((local_38 != 0.0) || (NAN(local_38))) {
              gch::detail::small_vector_base<std::allocator<double>,6u>::
              append_element<double_const&>
                        ((small_vector_base<std::allocator<double>,6u> *)__return_storage_ptr__,
                         &local_38);
              gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
                        ((small_vector_base<std::allocator<int>,6u> *)this,&local_3c);
            }
            uVar4 = uVar4 + 1;
          }
          uVar3 = uVar3 + 1;
        }
        bVar5 = uVar4 < (t1->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_size;
      } while ((bVar5) &&
              (uVar3 < (t2->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                       super_small_vector_data_base<double_*,_unsigned_long>.m_size));
    }
  }
  if (bVar5) {
    if (uVar4 < (t1->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_size) {
      do {
        local_3c = (t1->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
                   super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr[uVar4];
        local_38 = (t1->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                   super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr[uVar4];
        gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
                  ((small_vector_base<std::allocator<double>,6u> *)__return_storage_ptr__,&local_38)
        ;
        gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
                  ((small_vector_base<std::allocator<int>,6u> *)this,&local_3c);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (t1->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                       super_small_vector_data_base<double_*,_unsigned_long>.m_size);
    }
  }
  else if (uVar3 < (t2->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                   super_small_vector_data_base<double_*,_unsigned_long>.m_size) {
    do {
      local_3c = (t2->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr[uVar3];
      local_38 = (t2->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr[uVar3];
      gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
                ((small_vector_base<std::allocator<double>,6u> *)__return_storage_ptr__,&local_38);
      gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
                ((small_vector_base<std::allocator<int>,6u> *)this,&local_3c);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (t2->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                     super_small_vector_data_base<double_*,_unsigned_long>.m_size);
  }
  return __return_storage_ptr__;
}

Assistant:

Terms MergeSorted(const Terms& t1, const Terms& t2) {
  assert(t1.is_sorted());
  assert(t2.is_sorted());
  Terms result;
  result.reserve(t1.size() + t2.size());

  size_t i1=0, i2=0;
  while (true) {
    if (i1<t1.size() && i2<t2.size()) {
      auto t1i = t1.IndexValue(i1);
      auto t2i = t2.IndexValue(i2);
      if (t1i.first < t2i.first) {
        result.add_index_value(t1i);
        ++i1;
      } else if (t1i.first > t2i.first) {
        result.add_index_value(t2i);
        ++i2;
      } else {
        t1i.second += t2i.second;
        if (t1i.second)
          result.add_index_value(t1i);
        ++i1;
        ++i2;
      }
    } else if (i1<t1.size()) {
      for ( ; i1<t1.size(); ++i1) {
        auto t1i = t1.IndexValue(i1);
        result.add_index_value(t1i);
      }
      break;
    } else if (i2<t2.size()) {
      for ( ; i2<t2.size(); ++i2) {
        auto t2i = t2.IndexValue(i2);
        result.add_index_value(t2i);
      }
      break;
    } else
      break;
  }

  return result;
}